

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Char * copyString(XML_Char *s,XML_Memory_Handling_Suite *memsuite)

{
  char *pcVar1;
  void *__dest;
  XML_Char *pXVar2;
  size_t __n;
  
  __n = 0;
  do {
    pcVar1 = s + __n;
    __n = __n + 1;
  } while (*pcVar1 != '\0');
  __dest = (*memsuite->malloc_fcn)(__n);
  if (__dest != (void *)0x0) {
    pXVar2 = (XML_Char *)memcpy(__dest,s,__n);
    return pXVar2;
  }
  return (XML_Char *)0x0;
}

Assistant:

static XML_Char *
copyString(const XML_Char *s, const XML_Memory_Handling_Suite *memsuite) {
  size_t charsRequired = 0;
  XML_Char *result;

  /* First determine how long the string is */
  while (s[charsRequired] != 0) {
    charsRequired++;
  }
  /* Include the terminator */
  charsRequired++;

  /* Now allocate space for the copy */
  result = memsuite->malloc_fcn(charsRequired * sizeof(XML_Char));
  if (result == NULL)
    return NULL;
  /* Copy the original into place */
  memcpy(result, s, charsRequired * sizeof(XML_Char));
  return result;
}